

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O2

Vec4 __thiscall deqp::gles3::Functional::generateRandomColor(Functional *this,Random *random)

{
  int i;
  long lVar1;
  float fVar2;
  undefined8 extraout_XMM0_Qa;
  undefined4 extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  Vec4 VVar4;
  undefined8 uVar3;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this);
  uVar3 = extraout_XMM0_Qa;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    fVar2 = deRandom_getFloat(&random->m_rnd);
    uVar3 = CONCAT44(extraout_XMM0_Db,fVar2);
    *(float *)(this + lVar1 * 4) = fVar2;
  }
  *(undefined4 *)(this + 0xc) = 0x3f800000;
  VVar4.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar4.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  VVar4.m_data[0] = (float)(int)uVar3;
  VVar4.m_data[1] = (float)(int)((ulong)uVar3 >> 0x20);
  return (Vec4)VVar4.m_data;
}

Assistant:

static tcu::Vec4 generateRandomColor (de::Random& random)
{
	tcu::Vec4 retVal;

	for (int i = 0; i < 3; ++i)
		retVal[i] = random.getFloat();
	retVal[3] = 1.0f;

	return retVal;
}